

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall sing::HttpResponse::~HttpResponse(HttpResponse *this)

{
  HttpResponse *this_local;
  
  unmapFile(this);
  std::__cxx11::string::~string((string *)&this->path);
  std::__cxx11::string::~string((string *)&this->srcDir);
  std::__cxx11::string::~string((string *)&this->body);
  std::__cxx11::string::~string((string *)&this->statusMessage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->headers);
  return;
}

Assistant:

HttpResponse::~HttpResponse(){
    unmapFile();
}